

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O3

string_view __thiscall jhu::thrax::SAMTLabeler::operator()(SAMTLabeler *this,SpanPair nt)

{
  Tree *pTVar1;
  pointer pCVar2;
  short sVar3;
  ushort uVar4;
  pointer pCVar5;
  Node *pNVar6;
  Node **ppNVar7;
  Node *pNVar8;
  __normal_iterator<const_jhu::thrax::Node_*,_std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>_>
  _Var9;
  long lVar10;
  iterator iVar11;
  difference_type __d_9;
  Node *pNVar12;
  Node *pNVar13;
  difference_type __d_6;
  ulong uVar14;
  pointer pcVar15;
  string_view *psVar16;
  pointer pNVar17;
  pointer pNVar18;
  int iVar19;
  Node *pNVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  Node *pNVar24;
  difference_type __d_3;
  Node *pNVar25;
  difference_type __d_1;
  ulong uVar26;
  Node *pNVar27;
  difference_type __d_2;
  ulong uVar28;
  difference_type __d_5;
  short sVar29;
  pointer pNVar30;
  const_iterator __position;
  size_type sVar31;
  short sVar32;
  Span nt_00;
  ulong uVar33;
  string_view sVar34;
  optional<jhu::thrax::(anonymous_namespace)::Concat> rest;
  optional<jhu::thrax::(anonymous_namespace)::Constituent> label;
  __visit_result_t<jhu::thrax::(anonymous_namespace)::LabelVisitor,_std::variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>_>
  result;
  undefined1 local_d8 [8];
  char *pcStack_d0;
  undefined8 local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  undefined8 uStack_b0;
  __index_type local_a8;
  int local_a0;
  uint local_9c;
  ulong local_98;
  Node *local_90;
  _Storage<jhu::thrax::(anonymous_namespace)::Concat,_true> local_88;
  size_t local_68;
  char *pcStack_60;
  Tree *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar33 = (ulong)nt >> 0x20;
  nt_00 = nt.tgt;
  (this->key_).span = nt_00;
  __position._M_current =
       (this->cache_).
       super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>._M_impl
       .super__Vector_impl_data._M_start;
  pCVar5 = (this->cache_).
           super__Vector_base<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar14 = (long)pCVar5 - (long)__position._M_current;
  sVar32 = nt.tgt.start;
  sVar29 = nt.tgt.end;
  if (0 < (long)uVar14) {
    uVar14 = (uVar14 >> 3) * -0x3333333333333333;
    do {
      uVar23 = uVar14 >> 1;
      pCVar2 = __position._M_current + uVar23;
      sVar3 = (pCVar2->span).start;
      if ((sVar3 < sVar32) || (sVar3 == sVar32 && (pCVar2->span).end < sVar29)) {
        __position._M_current = pCVar2 + 1;
        uVar23 = uVar14 + ~uVar23;
      }
      uVar14 = uVar23;
    } while (0 < (long)uVar23);
  }
  iVar19 = (int)nt_00 >> 0x10;
  if (((__position._M_current == pCVar5) || (sVar32 != ((__position._M_current)->span).start)) ||
     (iVar19 != ((__position._M_current)->span).end)) {
    pTVar1 = &this->tree_;
    anon_unknown_0::constituent
              ((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)&local_88._M_value,pTVar1
               ,nt_00);
    if (local_88._M_value.b._M_len._0_1_ == '\x01') {
      local_d8 = (undefined1  [8])local_88._M_value.a._M_len;
      pcStack_d0 = local_88._M_value.a._M_str;
      local_a8 = '\0';
      lVar10 = 0;
    }
    else {
      pNVar24 = (this->tree_).
                super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      pNVar13 = (this->tree_).
                super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                super__Vector_impl_data._M_finish;
      local_58 = pTVar1;
      if (pNVar24 != pNVar13) {
        uVar23 = (long)pNVar13 - (long)pNVar24 >> 5;
        pNVar12 = pNVar24;
        uVar14 = uVar23;
        pNVar8 = pNVar24;
        pNVar27 = pNVar24;
        pNVar20 = pNVar24;
        if (0 < (long)uVar23) {
          while( true ) {
            uVar26 = uVar14 >> 1;
            sVar3 = pNVar12[uVar26].span.start;
            if (sVar32 <= sVar3) break;
            pNVar12 = pNVar12 + uVar26 + 1;
            uVar26 = ~uVar26 + uVar14;
LAB_00106ee0:
            uVar14 = uVar26;
            pNVar8 = pNVar12;
            if ((long)uVar26 < 1) goto LAB_00106f68;
          }
          if (sVar32 < sVar3) goto LAB_00106ee0;
          pNVar20 = pNVar12;
          uVar22 = uVar26;
          if (1 < uVar14) {
            do {
              uVar28 = uVar22 >> 1;
              uVar21 = uVar28;
              if (pNVar20[uVar28].span.start < sVar32) {
                uVar21 = ~uVar28 + uVar22;
                pNVar20 = pNVar20 + uVar28 + 1;
              }
              uVar22 = uVar21;
            } while (0 < (long)uVar21);
          }
          pNVar8 = pNVar12 + uVar26 + 1;
          uVar14 = (long)((long)pNVar12 + (uVar14 * 0x20 - (long)pNVar8)) >> 5;
          while (uVar26 = uVar14, pNVar12 = pNVar20, 0 < (long)uVar26) {
            uVar14 = uVar26 >> 1;
            if (pNVar8[uVar14].span.start <= sVar32) {
              pNVar8 = pNVar8 + uVar14 + 1;
              uVar14 = ~uVar14 + uVar26;
            }
          }
LAB_00106f68:
          while( true ) {
            uVar14 = uVar23 >> 1;
            sVar3 = pNVar27[uVar14].span.start;
            if (sVar29 <= sVar3) break;
            pNVar27 = pNVar27 + uVar14 + 1;
            uVar14 = ~uVar14 + uVar23;
LAB_00106f8e:
            uVar23 = uVar14;
            pNVar20 = pNVar27;
            if ((long)uVar14 < 1) goto joined_r0x0010701a;
          }
          if (sVar29 < sVar3) goto LAB_00106f8e;
          pNVar25 = pNVar27;
          uVar26 = uVar14;
          if (1 < uVar23) {
            do {
              uVar21 = uVar26 >> 1;
              uVar22 = uVar21;
              if (pNVar25[uVar21].span.start < sVar29) {
                uVar22 = ~uVar21 + uVar26;
                pNVar25 = pNVar25 + uVar21 + 1;
              }
              uVar26 = uVar22;
            } while (0 < (long)uVar22);
          }
          pNVar20 = pNVar27 + uVar14 + 1;
          uVar14 = (long)((long)pNVar27 + (uVar23 * 0x20 - (long)pNVar20)) >> 5;
          while (uVar23 = uVar14, pNVar27 = pNVar25, 0 < (long)uVar23) {
            uVar14 = uVar23 >> 1;
            if (pNVar20[uVar14].span.start <= sVar29) {
              pNVar20 = pNVar20 + uVar14 + 1;
              uVar14 = ~uVar14 + uVar23;
            }
          }
        }
joined_r0x0010701a:
        while (pNVar25 = pNVar8, pNVar8 = pNVar20, local_90 = pNVar13, pNVar12 <= pNVar25 + -1) {
          while (pNVar6 = pNVar8, pNVar8 = pNVar25 + -1, pNVar27 <= pNVar6 + -1) {
            pNVar8 = pNVar6 + -1;
            if (pNVar25[-1].span.end == pNVar6[-1].span.end) {
              local_d8 = (undefined1  [8])pNVar25[-1].label._M_len;
              pcStack_d0 = pNVar25[-1].label._M_str;
              local_c8 = pNVar6[-1].label._M_len;
              aStack_c0._M_allocated_capacity = (size_type)pNVar6[-1].label._M_str;
              local_a8 = '\x01';
              lVar10 = 1;
              local_88._M_value.a._M_len = (size_t)local_d8;
              local_88._M_value.a._M_str = pcStack_d0;
              local_88._M_value.b._M_len = local_c8;
              local_88._M_value.b._M_str = (char *)aStack_c0._M_allocated_capacity;
              goto LAB_00107291;
            }
          }
        }
        local_9c = (int)nt_00 << 0x10;
        psVar16 = &pNVar24->label;
        local_a0 = iVar19;
        local_98 = uVar33;
        do {
          uVar4 = *(ushort *)((long)(psVar16 + -1) + 8);
          if (sVar32 <= (short)uVar4) break;
          if (iVar19 == *(short *)((long)(psVar16 + -1) + 10)) {
            local_d8._0_4_ = uVar4 | local_9c;
            pcStack_d0 = (char *)0x0;
            local_c8 = 0;
            aStack_c0._M_allocated_capacity = 0;
            _Var9 = std::
                    __upper_bound<__gnu_cxx::__normal_iterator<jhu::thrax::Node_const*,std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>>,jhu::thrax::Node,__gnu_cxx::__ops::_Val_comp_iter<jhu::thrax::label(std::vector<jhu::thrax::Node,std::allocator<jhu::thrax::Node>>const&,jhu::thrax::Span)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                              (pNVar24,(this->tree_).
                                       super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>
                                       ._M_impl.super__Vector_impl_data._M_finish,local_d8);
            pNVar24 = (this->tree_).
                      super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pNVar13 = local_90;
            uVar33 = local_98;
            iVar19 = local_a0;
            if (((_Var9._M_current != pNVar24) && (uVar4 == _Var9._M_current[-1].span.start)) &&
               (sVar32 == _Var9._M_current[-1].span.end)) {
              local_88._M_value.b._M_len = _Var9._M_current[-1].label._M_len;
              local_88._M_value.b._M_str = _Var9._M_current[-1].label._M_str;
              local_88._M_value.a._M_len = psVar16->_M_len;
              local_88._M_value.a._M_str = psVar16->_M_str;
              local_a8 = '\x02';
              lVar10 = 2;
              local_d8 = (undefined1  [8])local_88._M_value.a._M_len;
              pcStack_d0 = local_88._M_value.a._M_str;
              local_c8 = local_88._M_value.b._M_len;
              aStack_c0._M_allocated_capacity = (size_type)local_88._M_value.b._M_str;
              goto LAB_00107291;
            }
          }
          ppNVar7 = (Node **)(psVar16 + 1);
          psVar16 = psVar16 + 2;
        } while ((Node *)(ppNVar7 + 1) != pNVar13);
      }
      pTVar1 = local_58;
      anon_unknown_0::concatenation
                ((optional<jhu::thrax::(anonymous_namespace)::Concat> *)&local_88._M_value,local_58,
                 SUB84(uVar33,0));
      if ((char)local_68 == '\x01') {
        local_c8 = local_88._M_value.b._M_len;
        aStack_c0._M_allocated_capacity = (size_type)local_88._M_value.b._M_str;
        local_d8 = (undefined1  [8])local_88._M_value.a._M_len;
        pcStack_d0 = local_88._M_value.a._M_str;
        local_a8 = '\x03';
        lVar10 = 3;
      }
      else {
        pNVar17 = (this->tree_).
                  super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar14 = (long)(this->tree_).
                       super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)pNVar17 >> 5;
        do {
          while( true ) {
            uVar23 = uVar14;
            if ((long)uVar23 < 1) goto LAB_00107270;
            uVar14 = uVar23 >> 1;
            sVar29 = pNVar17[uVar14].span.start;
            sVar32 = (short)uVar33;
            if (sVar32 <= sVar29) break;
            pNVar17 = pNVar17 + uVar14 + 1;
            uVar14 = ~uVar14 + uVar23;
          }
        } while (sVar32 < sVar29);
        uVar26 = uVar14;
        pNVar30 = pNVar17;
        if (1 < uVar23) {
          do {
            uVar21 = uVar26 >> 1;
            uVar22 = uVar21;
            if (pNVar30[uVar21].span.start < sVar32) {
              uVar22 = ~uVar21 + uVar26;
              pNVar30 = pNVar30 + uVar21 + 1;
            }
            uVar26 = uVar22;
          } while (0 < (long)uVar22);
        }
        pNVar18 = pNVar17 + uVar14 + 1;
        uVar14 = (long)((long)pNVar17 + (uVar23 * 0x20 - (long)pNVar18)) >> 5;
        while (uVar23 = uVar14, 0 < (long)uVar23) {
          uVar14 = uVar23 >> 1;
          if (pNVar18[uVar14].span.start <= sVar32) {
            pNVar18 = pNVar18 + uVar14 + 1;
            uVar14 = ~uVar14 + uVar23;
          }
        }
        if (pNVar30 < pNVar18) {
          do {
            anon_unknown_0::concatenation
                      ((optional<jhu::thrax::(anonymous_namespace)::Concat> *)local_d8,pTVar1,
                       (Span)((uint)(ushort)(pNVar30->span).end | (uint)SUB84(uVar33,0) & 0xffff0000
                             ));
            if ((bool)aStack_c0._M_local_buf[8] != false) {
              local_88._M_value.a._M_len = (pNVar30->label)._M_len;
              local_88._M_value.a._M_str = (pNVar30->label)._M_str;
              local_88._M_value.b._M_len = (size_t)local_d8;
              local_88._M_value.b._M_str = pcStack_d0;
              aStack_c0._8_8_ = local_c8;
              uStack_b0 = aStack_c0._M_allocated_capacity;
              local_a8 = '\x04';
              lVar10 = 4;
              local_d8 = (undefined1  [8])local_88._M_value.a._M_len;
              pcStack_d0 = local_88._M_value.a._M_str;
              local_c8 = local_88._M_value.b._M_len;
              aStack_c0._M_allocated_capacity = (size_type)local_88._M_value.b._M_str;
              local_68 = aStack_c0._8_8_;
              pcStack_60 = (char *)uStack_b0;
              goto LAB_00107291;
            }
            pNVar30 = pNVar30 + 1;
          } while (pNVar30 < pNVar18);
        }
LAB_00107270:
        local_d8 = (undefined1  [8])0x1;
        pcStack_d0 = "X";
        local_a8 = '\0';
        lVar10 = 0;
      }
    }
LAB_00107291:
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_jhu::thrax::(anonymous_namespace)::LabelVisitor_&&,_std::variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>_&&>
      ::_S_vtable._M_arr[lVar10]._M_data)
              (&local_50,(LabelVisitor *)&local_88,
               (variant<jhu::thrax::(anonymous_namespace)::Constituent,_jhu::thrax::(anonymous_namespace)::ForwardApply,_jhu::thrax::(anonymous_namespace)::BackwardApply,_jhu::thrax::(anonymous_namespace)::Concat,_jhu::thrax::(anonymous_namespace)::DoubleConcat>
                *)local_d8);
    local_d8._0_4_ = (int)uVar33;
    pcStack_d0 = (char *)&aStack_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pcStack_d0,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    iVar11 = std::vector<jhu::thrax::CachedLabel,_std::allocator<jhu::thrax::CachedLabel>_>::
             _M_insert_rval(&this->cache_,__position,(value_type *)local_d8);
    pcVar15 = ((iVar11._M_current)->label)._M_dataplus._M_p;
    sVar31 = ((iVar11._M_current)->label)._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcStack_d0 != &aStack_c0) {
      operator_delete(pcStack_d0,(ulong)(aStack_c0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pcVar15 = ((__position._M_current)->label)._M_dataplus._M_p;
    sVar31 = ((__position._M_current)->label)._M_string_length;
  }
  sVar34._M_str = pcVar15;
  sVar34._M_len = sVar31;
  return sVar34;
}

Assistant:

std::string_view SAMTLabeler::operator()(SpanPair nt) const {
  key_.span = nt.tgt;
  auto it = std::lower_bound(cache_.begin(), cache_.end(), key_, spanOrder);
  if (it != cache_.end() && it->span == nt.tgt) {
    return it->label;
  }
  auto result = std::visit(LabelVisitor{}, label(tree_, nt));
  return cache_.insert(it, CachedLabel{ nt.tgt, result })->label;
}